

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O1

UINT8 __thiscall VGMPlayer::LoadTags(VGMPlayer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint uVar3;
  UINT8 *pUVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  string *this_00;
  string local_60;
  string *local_40;
  char **local_38;
  
  lVar8 = 0x2f8;
  paVar1 = &local_60.field_2;
  do {
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::operator=
              ((string *)((long)&(this->super_PlayerBase)._vptr_PlayerBase + lVar8),
               (string *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                               local_60.field_2._M_local_buf[0]) + 1);
    }
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0x458);
  this->_tagList[0] = (char *)0x0;
  uVar5 = (this->_fileHdr).gd3Ofs;
  if ((ulong)uVar5 != 0) {
    uVar2 = (this->_fileHdr).eofOfs;
    uVar7 = uVar5 + 0xc;
    if (uVar2 < uVar7 || uVar2 <= uVar5) {
      return 0xf3;
    }
    pUVar4 = this->_fileData;
    if (*(int *)(pUVar4 + uVar5) != 0x20336447) {
      return 0xf0;
    }
    uVar3 = *(uint *)(pUVar4 + (uVar5 + 4));
    this->_tagVer = uVar3;
    if ((uVar3 & 0xffffff00) != 0x100) {
      return 0xf1;
    }
    local_38 = this->_tagList;
    uVar3 = *(int *)(pUVar4 + (uVar5 + 8)) + uVar7;
    if (uVar2 <= *(int *)(pUVar4 + (uVar5 + 8)) + uVar7) {
      uVar3 = uVar2;
    }
    local_40 = this->_tagData;
    lVar8 = 0;
    do {
      uVar5 = uVar7;
      if (uVar7 < uVar3) {
        uVar6 = (ulong)uVar7;
        do {
          if (*(short *)(this->_fileData + uVar6) == 0) break;
          uVar5 = (int)uVar6 + 2;
          uVar6 = (ulong)uVar5;
        } while (uVar5 < uVar3);
        GetUTF8String_abi_cxx11_(&local_60,this,this->_fileData + uVar7,this->_fileData + uVar6);
        this_00 = (string *)(local_40 + lVar8);
        std::__cxx11::string::operator=(this_00,(string *)&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != paVar1) {
          operator_delete(local_60._M_dataplus._M_p,
                          CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                   local_60.field_2._M_local_buf[0]) + 1);
        }
        *local_38 = _TAG_TYPE_LIST[lVar8];
        local_38[1] = *(char **)this_00;
        local_38 = local_38 + 2;
        uVar5 = (int)uVar6 + 2;
      }
    } while ((uVar7 < uVar3) && (lVar8 = lVar8 + 1, uVar7 = uVar5, lVar8 != 0xb));
    *local_38 = (char *)0x0;
  }
  return '\0';
}

Assistant:

UINT8 VGMPlayer::LoadTags(void)
{
	size_t curTag;
	
	for (curTag = 0; curTag < _TAG_COUNT; curTag ++)
		_tagData[curTag] = std::string();
	_tagList[0] = NULL;
	if (! _fileHdr.gd3Ofs)
		return 0x00;	// no GD3 tag present
	if (_fileHdr.gd3Ofs >= _fileHdr.eofOfs)
		return 0xF3;	// tag error (offset out-of-range)
	
	UINT32 curPos;
	UINT32 eotPos;
	
	if (_fileHdr.gd3Ofs + 0x0C > _fileHdr.eofOfs)	// separate check to catch overflows
		return 0xF3;	// tag error (GD3 header incomplete)
	if (memcmp(&_fileData[_fileHdr.gd3Ofs + 0x00], "Gd3 ", 4))
		return 0xF0;	// bad tag
	
	_tagVer = ReadLE32(&_fileData[_fileHdr.gd3Ofs + 0x04]);
	if (_tagVer < 0x100 || _tagVer >= 0x200)
		return 0xF1;	// unsupported tag version
	
	eotPos = ReadLE32(&_fileData[_fileHdr.gd3Ofs + 0x08]);
	curPos = _fileHdr.gd3Ofs + 0x0C;
	eotPos += curPos;
	if (eotPos > _fileHdr.eofOfs)
		eotPos = _fileHdr.eofOfs;
	
	const char **tagListEnd = _tagList;
	for (curTag = 0; curTag < _TAG_COUNT; curTag ++)
	{
		UINT32 startPos = curPos;
		if (curPos >= eotPos)
			break;
		
		// search for UTF-16 L'\0' character
		while(curPos < eotPos && ReadLE16(&_fileData[curPos]) != L'\0')
			curPos += 0x02;
		_tagData[curTag] = GetUTF8String(&_fileData[startPos], &_fileData[curPos]);
		curPos += 0x02;	// skip '\0'
		
		*(tagListEnd++) = _TAG_TYPE_LIST[curTag];
		*(tagListEnd++) = _tagData[curTag].c_str();
	}
	
	*tagListEnd = NULL;
	
	return 0x00;
}